

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<int,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),int(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ParameterDictionary *this,
          string *name,ParameterType type,char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_int_double_ptr_FileLoc_ptr *convert)

{
  string *__lhs;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *__lhs_00;
  ulong uVar3;
  __type_conflict _Var4;
  bool bVar5;
  int iVar6;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *pvVar7;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> *local_48;
  int local_40;
  int local_3c;
  char *local_38;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar8 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar8 = paVar1;
  }
  lVar11 = 0;
  local_48 = __return_storage_ptr__;
  local_40 = nPerItem;
  local_38 = typeName;
  while( true ) {
    if (sVar2 << 3 == lVar11) {
      (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      return local_48;
    }
    __lhs_00 = *(ParsedParameter **)((long)paVar8 + lVar11);
    __lhs = &__lhs_00->name;
    _Var4 = std::operator==(__lhs,name);
    if ((_Var4) && (bVar5 = std::operator==(&__lhs_00->type,local_38), bVar5)) break;
    lVar11 = lVar11 + 8;
  }
  pvVar7 = (*getValues)(__lhs_00);
  local_3c = local_40;
  uVar3 = pvVar7->nStored;
  if (uVar3 != 0) {
    uVar9 = (ulong)local_40;
    if (uVar3 % uVar9 == 0) {
      __lhs_00->lookedUp = true;
      std::vector<int,_std::allocator<int>_>::vector(local_48,uVar3 / uVar9,&local_49);
      lVar11 = 0;
      for (uVar10 = 0; uVar10 < uVar3 / uVar9; uVar10 = uVar10 + 1) {
        iVar6 = (*convert)((double *)((long)pvVar7->ptr + lVar11),&__lhs_00->loc);
        lVar11 = lVar11 + uVar9 * 8;
        (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar10] = iVar6;
      }
      return local_48;
    }
    ErrorExit<std::__cxx11::string_const&,int&>
              (&__lhs_00->loc,"Number of values provided for \"%s\" not a multiple of %d",__lhs,
               &local_3c);
  }
  ErrorExit<std::__cxx11::string_const&>(&__lhs_00->loc,"No values provided for \"%s\".",__lhs);
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}